

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

string * __thiscall
Catch::Detail::convertIntoString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,StringRef string)

{
  undefined1 uVar1;
  undefined1 in_R8B;
  StringRef string_00;
  
  string_00.m_start = string.m_start;
  uVar1 = (**(code **)(*(long *)*Context::currentContext + 0x50))();
  string_00.m_size._0_1_ = uVar1;
  string_00.m_size._1_7_ = 0;
  convertIntoString_abi_cxx11_(__return_storage_ptr__,this,string_00,(bool)in_R8B);
  return __return_storage_ptr__;
}

Assistant:

std::string convertIntoString(StringRef string) {
        return convertIntoString(string, getCurrentContext().getConfig()->showInvisibles());
    }